

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O3

Error asmjit::Logging::formatLine
                (StringBuilder *sb,uint8_t *binData,size_t binLen,size_t dispLen,size_t imLen,
                char *comment)

{
  Error EVar1;
  size_t i;
  size_t len;
  long lVar2;
  size_t sVar3;
  char c;
  ulong uVar4;
  bool bVar5;
  size_t begin;
  size_t local_50;
  
  len = 0;
  if (comment != (char *)0x0) {
    do {
      if (comment[len] == '\0') goto LAB_0015c43f;
      len = len + 1;
    } while (len != 0x200);
    len = 0x200;
  }
LAB_0015c43f:
  if (binLen < dispLen) {
    formatLine();
  }
  if (binLen - 1 < 0xfffffffffffffffe || len != 0) {
    sVar3 = sb->_length;
    c = ';';
    uVar4 = 0x28;
    bVar5 = binLen != 0xffffffffffffffff;
    local_50 = sVar3;
    while( true ) {
      if ((sVar3 < uVar4) && (EVar1 = StringBuilder::_opChars(sb,1,' ',uVar4 - sVar3), EVar1 != 0))
      {
        return EVar1;
      }
      EVar1 = StringBuilder::_opChar(sb,1,c);
      if (EVar1 != 0) {
        return EVar1;
      }
      EVar1 = StringBuilder::_opChar(sb,1,' ');
      if (EVar1 != 0) {
        return EVar1;
      }
      if (!bVar5) break;
      EVar1 = StringBuilder::_opHex(sb,1,binData,binLen - (dispLen + imLen));
      if (EVar1 != 0) {
        return EVar1;
      }
      EVar1 = StringBuilder::_opChars(sb,1,'.',dispLen * 2);
      if (EVar1 != 0) {
        return EVar1;
      }
      EVar1 = StringBuilder::_opHex(sb,1,binData + (binLen - imLen),imLen);
      if (EVar1 != 0) {
        return EVar1;
      }
      if (len == 0) goto LAB_0015c5b0;
      lVar2 = sVar3 - local_50;
      local_50 = sb->_length;
      bVar5 = false;
      uVar4 = uVar4 + 0x1a;
      c = '|';
      sVar3 = lVar2 + local_50;
    }
    EVar1 = StringBuilder::_opString(sb,1,comment,len);
    if (EVar1 != 0) {
      return EVar1;
    }
  }
LAB_0015c5b0:
  EVar1 = StringBuilder::_opChar(sb,1,'\n');
  return EVar1;
}

Assistant:

Error Logging::formatLine(StringBuilder& sb, const uint8_t* binData, size_t binLen, size_t dispLen, size_t imLen, const char* comment) noexcept {
  size_t currentLen = sb.getLength();
  size_t commentLen = comment ? Utils::strLen(comment, kMaxCommentLength) : 0;

  ASMJIT_ASSERT(binLen >= dispLen);

  if ((binLen != 0 && binLen != Globals::kInvalidIndex) || commentLen) {
    size_t align = kMaxInstLength;
    char sep = ';';

    for (size_t i = (binLen == Globals::kInvalidIndex); i < 2; i++) {
      size_t begin = sb.getLength();

      // Append align.
      if (currentLen < align)
        ASMJIT_PROPAGATE(sb.appendChars(' ', align - currentLen));

      // Append separator.
      if (sep) {
        ASMJIT_PROPAGATE(sb.appendChar(sep));
        ASMJIT_PROPAGATE(sb.appendChar(' '));
      }

      // Append binary data or comment.
      if (i == 0) {
        ASMJIT_PROPAGATE(sb.appendHex(binData, binLen - dispLen - imLen));
        ASMJIT_PROPAGATE(sb.appendChars('.', dispLen * 2));
        ASMJIT_PROPAGATE(sb.appendHex(binData + binLen - imLen, imLen));
        if (commentLen == 0) break;
      }
      else {
        ASMJIT_PROPAGATE(sb.appendString(comment, commentLen));
      }

      currentLen += sb.getLength() - begin;
      align += kMaxBinaryLength;
      sep = '|';
    }
  }

  return sb.appendChar('\n');
}